

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void la_global_sync(TCGContext_conflict9 *s,int ng)

{
  int iVar1;
  TCGTemp *ts;
  ulong uVar2;
  bool bVar3;
  
  ts = s->temps;
  uVar2 = 0;
  if (0 < ng) {
    uVar2 = (ulong)(uint)ng;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    iVar1 = (int)ts->state;
    ts->state = (long)iVar1 | 2;
    if (iVar1 == 1) {
      la_reset_pref(s,ts);
    }
    ts = ts + 1;
  }
  return;
}

Assistant:

static void la_global_sync(TCGContext *s, int ng)
{
    int i;

    for (i = 0; i < ng; ++i) {
        int state = s->temps[i].state;
        s->temps[i].state = state | TS_MEM;
        if (state == TS_DEAD) {
            /* If the global was previously dead, reset prefs.  */
            la_reset_pref(s, &s->temps[i]);
        }
    }
}